

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int lua_setfenv(lua_State *L,int idx)

{
  int iVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  StkId pTVar4;
  int iVar5;
  
  pTVar2 = L->top;
  iVar1 = pTVar2[-2].tt;
  if (iVar1 == 8) {
    pGVar3 = pTVar2[-2].value.gc;
    (pGVar3->th).l_gt.value = pTVar2[-1].value;
    (pGVar3->th).l_gt.tt = 5;
  }
  else {
    if ((iVar1 != 7) && (iVar5 = 0, pTVar4 = pTVar2, iVar1 != 6)) goto LAB_0010e261;
    ((pTVar2[-2].value.gc)->h).array = (TValue *)pTVar2[-1].value;
  }
  pTVar4 = L->top;
  iVar5 = 1;
  if (((((pTVar4[-1].value.gc)->gch).marked & 3) != 0) &&
     ((((pTVar2[-2].value.gc)->gch).marked & 4) != 0)) {
    luaC_barrierf(L,pTVar2[-2].value.gc,pTVar4[-1].value.gc);
    pTVar4 = L->top;
  }
LAB_0010e261:
  L->top = pTVar4 + -1;
  return iVar5;
}

Assistant:

static int lua_setfenv(lua_State*L,int idx){
StkId o;
int res=1;
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
luai_apicheck(L,ttistable(L->top-1));
switch(ttype(o)){
case 6:
clvalue(o)->c.env=hvalue(L->top-1);
break;
case 7:
uvalue(o)->env=hvalue(L->top-1);
break;
case 8:
sethvalue(L,gt(thvalue(o)),hvalue(L->top-1));
break;
default:
res=0;
break;
}
if(res)luaC_objbarrier(L,gcvalue(o),hvalue(L->top-1));
L->top--;
return res;
}